

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sturmchain.h
# Opt level: O2

void __thiscall
gmath::SturmChain<double>::SturmChain(SturmChain<double> *this,Polynomial<double> *p)

{
  Polynomial<double> *pPVar1;
  int iVar2;
  long *plVar3;
  ulong uVar4;
  Polynomial<double> *this_00;
  long lVar5;
  long lVar6;
  Polynomial<double> r;
  Polynomial<double> q;
  Polynomial<double> local_40;
  
  Polynomial<double>::Polynomial(&q);
  Polynomial<double>::Polynomial(&r);
  this->n = 0;
  iVar2 = p->used;
  lVar5 = (long)iVar2;
  uVar4 = 0xffffffffffffffff;
  if (-1 < lVar5) {
    uVar4 = lVar5 * 0x10 + 8;
  }
  plVar3 = (long *)operator_new__(uVar4);
  *plVar3 = lVar5;
  pPVar1 = (Polynomial<double> *)(plVar3 + 1);
  if (iVar2 != 0) {
    lVar6 = 0;
    this_00 = pPVar1;
    do {
      Polynomial<double>::Polynomial(this_00);
      lVar6 = lVar6 + -0x10;
      this_00 = this_00 + 1;
    } while (-lVar6 != lVar5 * 0x10);
  }
  this->f = pPVar1;
  Polynomial<double>::operator=(pPVar1,p);
  while (1 < this->f->used) {
    d<double>((gmath *)&local_40,this->f);
    Polynomial<double>::operator=(this->f + 1,&local_40);
    Polynomial<double>::~Polynomial(&local_40);
    iVar2 = 2;
    while( true ) {
      this->n = iVar2;
      pPVar1 = this->f;
      if ((pPVar1->used <= iVar2) || (pPVar1[(long)iVar2 + -1].used < 2)) goto LAB_00110d0d;
      div<double>(pPVar1 + (long)iVar2 + -2,pPVar1 + (long)iVar2 + -1,&q,&r);
      if (((r.used == 1) && (*r.c == 0.0)) && (!NAN(*r.c))) break;
      Polynomial<double>::operator-(&local_40);
      Polynomial<double>::operator=(this->f + this->n,&local_40);
      Polynomial<double>::~Polynomial(&local_40);
      iVar2 = this->n + 1;
    }
    div<double>(this->f,this->f + (long)this->n + -1,&q,&r);
    Polynomial<double>::operator=(this->f,&q);
  }
LAB_00110d0d:
  Polynomial<double>::~Polynomial(&r);
  Polynomial<double>::~Polynomial(&q);
  return;
}

Assistant:

SturmChain(const Polynomial<T> &p)
    {
      Polynomial<T> q, r;

      assert(p.getDegree() > 0);

      n=0;
      f=new Polynomial<T> [p.getDegree()+1];

      f[0]=p;

      bool compute=true;

      while (compute && f[0].getDegree() > 0)
      {
        compute=false;

        f[1]=d(f[0]);

        n=2;

        while (n < f[0].getDegree()+1 && f[n-1].getDegree() > 0)
        {
          div(f[n-2], f[n-1], q, r);

          // check for multiple roots

          if (r.getDegree() == 0 && r[0] == 0)
          {
            // f[n-1] is the common divisor of f[0], divide it out to get
            // rid of multiple roots and restart computation of Sturm chain

            div(f[0], f[n-1], q, r);
            f[0]=q;
            compute=true;
            break;
          }

          f[n]=-r;
          n++;
        }
      }
    }